

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipEntry.hpp
# Opt level: O0

ZipEntryInfo * Zippy::Impl::ZipEntry::CreateInfo(string *name)

{
  uint32_t uVar1;
  time_t tVar2;
  const_reference pvVar3;
  char *__src;
  ZipEntryInfo *in_RDI;
  ZipEntryInfo *info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *this;
  
  uVar1 = GetNewIndex(0);
  in_RDI->m_file_index = uVar1;
  in_RDI->m_central_dir_ofs = 0;
  in_RDI->m_version_made_by = 0;
  in_RDI->m_version_needed = 0;
  in_RDI->m_bit_flag = 0;
  in_RDI->m_method = 0;
  tVar2 = time((time_t *)0x0);
  in_RDI->m_time = tVar2;
  in_RDI->m_crc32 = 0;
  in_RDI->m_comp_size = 0;
  in_RDI->m_uncomp_size = 0;
  in_RDI->m_internal_attr = 0;
  in_RDI->m_external_attr = 0;
  in_RDI->m_local_header_ofs = 0;
  in_RDI->m_comment_size = 0;
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     (in_stack_ffffffffffffffe0);
  in_RDI->m_is_directory = (uint)(*pvVar3 == '/');
  in_RDI->m_is_encrypted = 0;
  in_RDI->m_is_supported = 1;
  this = in_RDI->m_filename;
  __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  strncpy(this,__src,0x200);
  strncpy(in_RDI->m_comment,"",0x200);
  return in_RDI;
}

Assistant:

static ZipEntryInfo CreateInfo(const std::string& name) {

                ZipEntryInfo info;

                info.m_file_index       = GetNewIndex(0);
                info.m_central_dir_ofs  = 0;
                info.m_version_made_by  = 0;
                info.m_version_needed   = 0;
                info.m_bit_flag         = 0;
                info.m_method           = 0;
                info.m_time             = time(nullptr);
                info.m_crc32            = 0;
                info.m_comp_size        = 0;
                info.m_uncomp_size      = 0;
                info.m_internal_attr    = 0;
                info.m_external_attr    = 0;
                info.m_local_header_ofs = 0;
                info.m_comment_size     = 0;
                info.m_is_directory     = (name.back() == '/');
                info.m_is_encrypted     = false;
                info.m_is_supported     = true;

#if _MSC_VER    // On MSVC, use the safe version of strcpy
                strcpy_s(info.m_filename, sizeof info.m_filename, name.c_str());
                strcpy_s(info.m_comment, sizeof info.m_comment, "");
#else           // Otherwise, use the unsafe version as fallback :(
                strncpy(info.m_filename, name.c_str(), sizeof info.m_filename);
                strncpy(info.m_comment, "", sizeof info.m_comment);
#endif

                return info;
            }